

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O2

void * anon_unknown.dwarf_2cf95::checking_global_allocfunc
                 (upb_alloc *alloc,void *ptr,size_t oldsize,size_t size)

{
  undefined4 *puVar1;
  void *__ptr;
  
  if (ptr == (void *)0x0) {
    __ptr = (void *)0x0;
  }
  else {
    if (*(int *)((long)ptr + -0x10) != 0x5afe) {
      __assert_fail("*reinterpret_cast<int*>(ptr) == 0x5AFE",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
                    ,0x1e9,
                    "void *(anonymous namespace)::checking_global_allocfunc(upb_alloc *, void *, size_t, size_t)"
                   );
    }
    __ptr = (void *)((long)ptr + -0x10);
  }
  if (size == 0) {
    free(__ptr);
  }
  else {
    if (oldsize == 0) {
      puVar1 = (undefined4 *)malloc(size + 0x10);
    }
    else {
      puVar1 = (undefined4 *)realloc(__ptr,size + 0x10);
    }
    if (puVar1 != (undefined4 *)0x0) {
      *puVar1 = 0x5afe;
      return puVar1 + 4;
    }
  }
  return (void *)0x0;
}

Assistant:

static void* checking_global_allocfunc(upb_alloc* alloc, void* ptr,
                                       size_t oldsize, size_t size) {
  int header_size = std::max(alignof(max_align_t), sizeof(int));
  if (ptr) {
    ptr = UPB_PTR_AT(ptr, -header_size, void);
    UPB_ASSERT(*reinterpret_cast<int*>(ptr) == 0x5AFE);
  }
  if (size == 0) {
    free(ptr);
    return nullptr;
  }
  void* ret;
  if (oldsize == 0) {
    ret = malloc(size + header_size);
  } else {
    ret = realloc(ptr, size + header_size);
  }
  if (ret) {
    *reinterpret_cast<int*>(ret) = 0x5AFE;
    return UPB_PTR_AT(ret, header_size, void);
  }
  return ret;
}